

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O2

void __thiscall
CTestGen9Resource_Test2DTileYfResource_Test::TestBody
          (CTestGen9Resource_Test2DTileYfResource_Test *this)

{
  uint uVar1;
  GMM_RESOURCE_FORMAT GVar2;
  uint32_t uVar3;
  GMM_RESOURCE_INFO *pGVar4;
  uint32_t *puVar5;
  long lVar6;
  TEST_BPP TVar7;
  uint *puVar8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint *local_38;
  
  local_58 = 0;
  uStack_a0 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_b8 = 2;
  uStack_50 = 0x100000000;
  local_a8 = 0x3000000000;
  uStack_b0 = 0x400000000;
  TVar7 = TEST_BPP_8;
  puVar5 = &DAT_0018e370;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    GVar2 = CTestResource::SetResourceFormat((CTestResource *)this,TVar7);
    local_b8 = CONCAT44(GVar2,(undefined4)local_b8);
    local_88 = 1;
    uStack_80 = CONCAT44(uStack_80._4_4_,1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e330 + lVar6));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e350 + lVar6));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,*puVar5);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar4,0x1000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    TVar7 = TVar7 + TEST_BPP_16;
    puVar5 = puVar5 + 2;
  }
  TVar7 = TEST_BPP_8;
  puVar8 = &DAT_0018e370;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    GVar2 = CTestResource::SetResourceFormat((CTestResource *)this,TVar7);
    local_b8 = CONCAT44(GVar2,(undefined4)local_b8);
    uVar1 = *puVar8;
    uVar3 = CTestResource::GetBppValue((CTestResource *)this,TVar7);
    local_88 = (ulong)(uVar1 / uVar3 + 1);
    uStack_80 = 0x100000001;
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8,(ulong)uVar1 % (ulong)uVar3);
    local_38 = puVar8;
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e330 + lVar6));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e350 + lVar6));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar4,0x2000);
    puVar8 = local_38;
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    TVar7 = TVar7 + TEST_BPP_16;
    puVar8 = puVar8 + 2;
  }
  TVar7 = TEST_BPP_8;
  for (lVar6 = 0; lVar6 != 0x14; lVar6 = lVar6 + 4) {
    GVar2 = CTestResource::SetResourceFormat((CTestResource *)this,TVar7);
    local_b8 = CONCAT44(GVar2,(undefined4)local_b8);
    uVar3 = CTestResource::GetBppValue((CTestResource *)this,TVar7);
    uVar1 = *(uint *)((long)&DAT_0018e370 + lVar6 * 2);
    local_88 = (ulong)(uVar1 / uVar3 + 1);
    uStack_80 = CONCAT44(1,*(int *)((long)&DAT_0018e374 + lVar6 * 2) + 1);
    pGVar4 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_b8,(ulong)uVar1 % (ulong)uVar3);
    CTestResource::VerifyResourceHAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e330 + lVar6));
    CTestResource::VerifyResourceVAlign<true>
              ((CTestResource *)this,pGVar4,*(uint32_t *)((long)&DAT_0018e350 + lVar6));
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar4,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar4,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar4,0x4000);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar4);
    TVar7 = TVar7 + TEST_BPP_16;
  }
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test2DTileYfResource)
{
    const uint32_t HAlign[TEST_BPP_MAX] = {64, 64, 32, 32, 16};
    const uint32_t VAlign[TEST_BPP_MAX] = {64, 32, 32, 16, 16};

    const uint32_t TileSize[TEST_BPP_MAX][2] = {{64, 64},
                                                {128, 32},
                                                {128, 32},
                                                {256, 16},
                                                {256, 16}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_2D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledY    = 1;
    gmmParams.Flags.Info.TiledYf   = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    //Allocate 1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]); // As wide as 1 Tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);       // 1 Tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));    // 1 Tile Big
        VerifyResourceQPitch<false>(ResourceInfo, 0);            // Not Tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate surface that requires multi tiles in two dimension
    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4) * 2);    // 2 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1; // 1 pixel larger than 1 tile width
        gmmParams.BaseHeight  = TileSize[i][1] + 1;                      // 1 row larger than 1 tile height
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign[i]);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign[i]);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0] * 2); // As wide as 2 tile
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);           // 2 tile wide
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4) * 4);    // 4 tile big

        VerifyResourceQPitch<false>(ResourceInfo, 0); // Not tested

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}